

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_sampler_expression_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  uint32_t uVar1;
  SPIRCombinedImageSampler *pSVar2;
  long lVar3;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  uint32_t local_5c;
  uint32_t samp_id;
  size_type index;
  undefined1 local_48 [8];
  string expr;
  SPIRCombinedImageSampler *combined;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                     ((Compiler *)CONCAT44(in_register_00000034,id),in_EDX);
  if (pSVar2 == (SPIRCombinedImageSampler *)0x0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&index + 4),in_EDX);
  }
  else {
    index._4_4_ = (pSVar2->image).id;
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&index + 4));
  CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(uVar1,0));
  lVar3 = ::std::__cxx11::string::find_first_of((char)local_48,0x5b);
  local_5c = 0;
  if (pSVar2 != (SPIRCombinedImageSampler *)0x0) {
    local_5c = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->sampler);
  }
  if (lVar3 == -1) {
    if (local_5c == 0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&this->super_CompilerGLSL,id,SUB41(local_5c,0));
    }
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)local_48);
    ::std::__cxx11::string::substr((ulong)local_b0,(ulong)local_48);
    if (local_5c == 0) {
      ::std::operator+(local_d0,local_90);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       local_d0);
      ::std::__cxx11::string::~string((string *)local_d0);
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&this->super_CompilerGLSL,id,SUB41(local_5c,0));
    }
    ::std::__cxx11::string::~string(local_b0);
    ::std::__cxx11::string::~string((string *)local_90);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

string CompilerMSL::to_sampler_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	uint32_t samp_id = 0;
	if (combined)
		samp_id = combined->sampler;

	if (index == string::npos)
		return samp_id ? to_expression(samp_id) : expr + sampler_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return samp_id ? to_expression(samp_id) : (image_expr + sampler_name_suffix + array_expr);
	}
}